

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O3

RNGState * anon_unknown.dwarf_5b3ec2::GetRNGState(void)

{
  long lVar1;
  int iVar2;
  allocator_type *__a;
  size_type in_RSI;
  vector<(anonymous_namespace)::RNGState,_secure_allocator<(anonymous_namespace)::RNGState>_> *this;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((anonymous_namespace)::GetRNGState()::g_rng == '\0') {
    this = (vector<(anonymous_namespace)::RNGState,_secure_allocator<(anonymous_namespace)::RNGState>_>
            *)&(anonymous_namespace)::GetRNGState()::g_rng;
    iVar2 = __cxa_guard_acquire();
    if (iVar2 != 0) {
      std::
      vector<(anonymous_namespace)::RNGState,_secure_allocator<(anonymous_namespace)::RNGState>_>::
      vector(this,in_RSI,__a);
      __cxa_atexit(std::
                   vector<(anonymous_namespace)::RNGState,_secure_allocator<(anonymous_namespace)::RNGState>_>
                   ::~vector,&GetRNGState::g_rng,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::GetRNGState()::g_rng);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return GetRNGState::g_rng.
           super__Vector_base<(anonymous_namespace)::RNGState,_secure_allocator<(anonymous_namespace)::RNGState>_>
           ._M_impl.super__Vector_impl_data._M_start;
  }
  __stack_chk_fail();
}

Assistant:

RNGState& GetRNGState() noexcept
{
    // This idiom relies on the guarantee that static variable are initialized
    // on first call, even when multiple parallel calls are permitted.
    static std::vector<RNGState, secure_allocator<RNGState>> g_rng(1);
    return g_rng[0];
}